

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plaRead.c
# Opt level: O1

void Pla_ReadAddBody(Pla_Man_t *p,Vec_Str_t *vLits)

{
  uint uVar1;
  int iVar2;
  word *pwVar3;
  word *pwVar4;
  uint uVar5;
  int *piVar6;
  long lVar7;
  int iVar8;
  uint uVar9;
  ulong uVar10;
  word extraout_RDX;
  word extraout_RDX_00;
  word extraout_RDX_01;
  word Fill;
  word Fill_00;
  long lVar11;
  uint uVar12;
  long lVar13;
  int iVar14;
  byte bVar15;
  ulong uVar16;
  
  iVar8 = p->nOuts + p->nIns;
  uVar16 = (long)vLits->nSize / (long)iVar8;
  if (vLits->nSize % iVar8 != 0) {
    __assert_fail("Vec_StrSize(vLits) % (p->nIns + p->nOuts) == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/pla/plaRead.c"
                  ,0xa2,"void Pla_ReadAddBody(Pla_Man_t *, Vec_Str_t *)");
  }
  uVar9 = (uint)uVar16;
  uVar12 = (p->vCubes).nSize;
  if (uVar9 != uVar12) {
    printf("Warning: Declared number of cubes (%d) differs from the actual (%d).\n",(ulong)uVar12,
           uVar16 & 0xffffffff);
    iVar8 = (p->vCubes).nSize;
    if ((int)uVar9 < iVar8) {
      if ((p->vCubes).nSize < (int)uVar9) {
        __assert_fail("p->nSize >= nSizeNew",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                      ,0x2b7,"void Vec_IntShrink(Vec_Int_t *, int)");
      }
      (p->vCubes).nSize = uVar9;
    }
    else {
      if ((int)uVar9 <= iVar8) {
        __assert_fail("nCubesReal > Pla_ManCubeNum(p)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/pla/plaRead.c"
                      ,0xab,"void Pla_ReadAddBody(Pla_Man_t *, Vec_Str_t *)");
      }
      Fill = extraout_RDX;
      if ((p->vCubes).nCap < (int)uVar9) {
        piVar6 = (p->vCubes).pArray;
        if (piVar6 == (int *)0x0) {
          piVar6 = (int *)malloc((long)(int)uVar9 << 2);
          Fill = extraout_RDX_01;
        }
        else {
          piVar6 = (int *)realloc(piVar6,(long)(int)uVar9 << 2);
          Fill = extraout_RDX_00;
        }
        (p->vCubes).pArray = piVar6;
        if (piVar6 == (int *)0x0) {
          __assert_fail("p->pArray",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                        ,0x217,"void Vec_IntGrow(Vec_Int_t *, int)");
        }
        (p->vCubes).nCap = uVar9;
      }
      if (0 < (int)uVar9) {
        piVar6 = (p->vCubes).pArray;
        Fill = 0;
        do {
          piVar6[Fill] = (int)Fill;
          Fill = Fill + 1;
        } while ((uVar16 & 0xffffffff) != Fill);
      }
      (p->vCubes).nSize = uVar9;
      Vec_WrdFillExtra(&p->vInBits,p->nInWords * uVar9,Fill);
      Vec_WrdFillExtra(&p->vOutBits,p->nOutWords * uVar9,Fill_00);
    }
  }
  lVar7 = (long)(p->vCubes).nSize;
  if (lVar7 < 1) {
    uVar12 = 0;
  }
  else {
    iVar8 = p->nInWords;
    lVar11 = 0;
    uVar12 = 0;
    do {
      lVar13 = lVar11 * iVar8;
      if ((((lVar13 < 0) || ((p->vInBits).nSize <= lVar13)) ||
          (uVar9 = p->nOutWords * (int)lVar11, (int)uVar9 < 0)) ||
         ((p->vOutBits).nSize <= (int)uVar9)) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecWrd.h"
                      ,0x1be,"word *Vec_WrdEntryP(Vec_Wrd_t *, int)");
      }
      pwVar3 = (p->vOutBits).pArray;
      iVar14 = p->nIns;
      uVar1 = uVar12;
      if (0 < iVar14) {
        pwVar4 = (p->vInBits).pArray;
        uVar1 = iVar14 + uVar12;
        bVar15 = 0;
        uVar16 = 0;
        do {
          if (((int)uVar12 < 0) || (vLits->nSize <= (int)(uVar12 + (int)uVar16))) goto LAB_003f9b01;
          uVar10 = uVar16 >> 5 & 0x7ffffff;
          pwVar4[lVar13 + uVar10] =
               (ulong)(uint)(int)vLits->pArray[uVar16 + uVar12] << (bVar15 & 0x3e) |
               pwVar4[lVar13 + uVar10];
          uVar16 = uVar16 + 1;
          bVar15 = bVar15 + 2;
        } while (iVar14 != (int)uVar16);
      }
      iVar2 = p->nOuts;
      uVar5 = uVar1;
      if (0 < iVar2) {
        bVar15 = 0;
        if (iVar14 < 1) {
          iVar14 = 0;
        }
        uVar16 = 0;
        do {
          if (((int)uVar1 < 0) || (vLits->nSize <= (int)(uVar1 + (int)uVar16))) {
LAB_003f9b01:
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecStr.h"
                          ,0x164,"char Vec_StrEntry(Vec_Str_t *, int)");
          }
          uVar10 = uVar16 >> 5 & 0x7ffffff;
          pwVar3[uVar9 + uVar10] =
               (ulong)(uint)(int)vLits->pArray[uVar16 + uVar1] << (bVar15 & 0x3e) |
               pwVar3[uVar9 + uVar10];
          uVar16 = uVar16 + 1;
          bVar15 = bVar15 + 2;
          uVar5 = uVar12 + iVar14 + iVar2;
        } while (iVar2 != (int)uVar16);
      }
      uVar12 = uVar5;
      lVar11 = lVar11 + 1;
    } while (lVar11 != lVar7);
  }
  if (uVar12 != vLits->nSize) {
    __assert_fail("Count == Vec_StrSize(vLits)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/pla/plaRead.c"
                  ,0xb8,"void Pla_ReadAddBody(Pla_Man_t *, Vec_Str_t *)");
  }
  return;
}

Assistant:

void Pla_ReadAddBody( Pla_Man_t * p, Vec_Str_t * vLits )
{
    word * pCubeIn, * pCubeOut; 
    int i, k, Lit, Count = 0; 
    int nCubesReal = Vec_StrSize(vLits) / (p->nIns + p->nOuts);
    assert( Vec_StrSize(vLits) % (p->nIns + p->nOuts) == 0 );
    if ( nCubesReal != Pla_ManCubeNum(p) )
    {
        printf( "Warning: Declared number of cubes (%d) differs from the actual (%d).\n", 
            Pla_ManCubeNum(p), nCubesReal );
        if ( nCubesReal < Pla_ManCubeNum(p) )
            Vec_IntShrink( &p->vCubes, nCubesReal );
        else
        {
            assert( nCubesReal > Pla_ManCubeNum(p) );
            Vec_IntFillNatural( &p->vCubes, nCubesReal );
            Vec_WrdFillExtra( &p->vInBits,  nCubesReal * p->nInWords,  0 );
            Vec_WrdFillExtra( &p->vOutBits, nCubesReal * p->nOutWords, 0 );
        }
    }
    Pla_ForEachCubeInOut( p, pCubeIn, pCubeOut, i )
    {
        Pla_CubeForEachLit( p->nIns, pCubeIn, Lit, k )
            Pla_CubeSetLit( pCubeIn, k, (Pla_Lit_t)Vec_StrEntry(vLits, Count++) );
        Pla_CubeForEachLit( p->nOuts, pCubeOut, Lit, k )
            Pla_CubeSetLit( pCubeOut, k, (Pla_Lit_t)Vec_StrEntry(vLits, Count++) );
    }
    assert( Count == Vec_StrSize(vLits) );
}